

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O3

int dlep_extension_radio_write_session_update
              (dlep_extension *ext,dlep_session *session,oonf_layer2_neigh_key *neigh)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  avl_tree *paVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  
  pcVar2 = (session->l2_listener).name;
  paVar4 = oonf_layer2_get_net_tree();
  lVar5 = avl_find(paVar4,pcVar2);
  if (lVar5 == 0) {
    iVar3 = -1;
    if (((&log_global_mask)[session->log_source] & 4) != 0) {
      oonf_log(4,(ulong)session->log_source,"src/generic/dlep/dlep_extension.c",0x163,0,0,
               "Could not find l2net for new interface");
    }
  }
  else {
    iVar3 = dlep_writer_map_l2neigh_data
                      (&session->writer,ext,(oonf_layer2_data *)(lVar5 + -0x410),
                       (oonf_layer2_data *)0x0);
    if (iVar3 == 0) {
      iVar3 = dlep_writer_map_l2net_data(&session->writer,ext,(oonf_layer2_data *)(lVar5 + -0x690));
      if (iVar3 == 0) {
        return 0;
      }
      uVar7 = (ulong)session->log_source;
      if (((&log_global_mask)[uVar7] & 4) == 0) {
        return iVar3;
      }
      iVar1 = ext->id;
      uVar6 = 0x16f;
    }
    else {
      uVar7 = (ulong)session->log_source;
      if (((&log_global_mask)[uVar7] & 4) == 0) {
        return iVar3;
      }
      iVar1 = ext->id;
      uVar6 = 0x169;
    }
    oonf_log(4,uVar7,"src/generic/dlep/dlep_extension.c",uVar6,0,0,
             "tlv mapping for extension %d failed: %d",iVar1,iVar3);
  }
  return iVar3;
}

Assistant:

int
dlep_extension_radio_write_session_update(
  struct dlep_extension *ext, struct dlep_session *session, const struct oonf_layer2_neigh_key *neigh __attribute__((unused))) {
  struct oonf_layer2_net *l2net;
  int result;

  l2net = oonf_layer2_net_get(session->l2_listener.name);
  if (!l2net) {
    OONF_WARN(session->log_source, "Could not find l2net for new interface");
    return -1;
  }

  result = dlep_writer_map_l2neigh_data(&session->writer, ext, l2net->neighdata, NULL);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }

  result = dlep_writer_map_l2net_data(&session->writer, ext, l2net->data);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }
  return 0;
}